

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateCMessage
               (Descriptor *message,Printer *printer)

{
  undefined8 uVar1;
  int iVar2;
  WellKnownType WVar3;
  int iVar4;
  string *psVar5;
  FileDescriptor *this;
  string *psVar6;
  Descriptor *message_00;
  EnumDescriptor *desc;
  FileDescriptor *file;
  int local_270;
  int local_26c;
  int i_5;
  int i_4;
  OneofDescriptor *local_248;
  OneofDescriptor *oneof_1;
  undefined1 local_238 [4];
  int i_3;
  FieldDescriptor *local_218;
  FieldDescriptor *field_1;
  undefined1 local_208 [4];
  int i_2;
  OneofDescriptor *local_1e8;
  OneofDescriptor *oneof;
  undefined1 local_1d8 [4];
  int i_1;
  FieldDescriptor *local_1b8;
  FieldDescriptor *field;
  undefined1 local_1a8 [4];
  int i;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  string local_138;
  Options local_118;
  undefined1 local_d8 [8];
  string php_name;
  string local_b0;
  allocator local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string c_name;
  Printer *printer_local;
  Descriptor *message_local;
  
  c_name.field_2._8_8_ = printer;
  psVar5 = Descriptor::full_name_abi_cxx11_(message);
  std::__cxx11::string::string((string *)local_38,(string *)psVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,".",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b0,"_",(allocator *)(php_name.field_2._M_local_buf + 0xf));
  StringReplace(&local_58,(string *)local_38,&local_78,&local_b0,true);
  std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(php_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_118.is_descriptor = false;
  local_118.aggregate_metadata = false;
  local_118.gen_c_wkt = false;
  local_118._3_5_ = 0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl._0_8_ = 0;
  local_118.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Options::Options(&local_118);
  FullClassName<google::protobuf::Descriptor>((string *)local_d8,message,&local_118);
  Options::~Options(&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"\\",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"\\\\",&local_181);
  StringReplace(&local_138,(string *)local_d8,&local_158,&local_180,true);
  std::__cxx11::string::operator=((string *)local_d8,(string *)&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  uVar1 = c_name.field_2._8_8_;
  this = Descriptor::file(message);
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_1a8,(_anonymous_namespace_ *)this,file);
  io::Printer::Print<char[12],std::__cxx11::string,char[7],std::__cxx11::string>
            ((Printer *)uVar1,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nstatic PHP_METHOD($c_name$, __construct) {\n  $file_c_name$_AddDescriptor();\n  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n}\n\n"
             ,(char (*) [12])"file_c_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [7])0x77c27b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_1a8);
  for (field._4_4_ = 0; iVar4 = field._4_4_, iVar2 = Descriptor::field_count(message), iVar4 < iVar2
      ; field._4_4_ = field._4_4_ + 1) {
    local_1b8 = Descriptor::field(message,field._4_4_);
    uVar1 = c_name.field_2._8_8_;
    psVar5 = FieldDescriptor::name_abi_cxx11_(local_1b8);
    psVar6 = FieldDescriptor::name_abi_cxx11_(local_1b8);
    UnderscoresToCamelCase((string *)local_1d8,psVar6,true);
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,
               "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n                                           \"$name$\");\n  zval ret;\n  Message_get(intern, f, &ret);\n  RETURN_COPY_VALUE(&ret);\n}\n\nstatic PHP_METHOD($c_name$, set$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n                                           \"$name$\");\n  zval *val;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n      == FAILURE) {\n    return;\n  }\n  Message_set(intern, f, val);\n  RETURN_COPY(getThis());\n}\n\n"
               ,(char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [5])0x77db8d,psVar5,(char (*) [11])"camel_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
  }
  for (oneof._4_4_ = 0; iVar4 = oneof._4_4_, iVar2 = Descriptor::real_oneof_decl_count(message),
      iVar4 < iVar2; oneof._4_4_ = oneof._4_4_ + 1) {
    local_1e8 = Descriptor::oneof_decl(message,oneof._4_4_);
    uVar1 = c_name.field_2._8_8_;
    psVar5 = OneofDescriptor::name_abi_cxx11_(local_1e8);
    psVar6 = OneofDescriptor::name_abi_cxx11_(local_1e8);
    UnderscoresToCamelCase((string *)local_208,psVar6,true);
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,
               "static PHP_METHOD($c_name$, get$camel_name$) {\n  Message* intern = (Message*)Z_OBJ_P(getThis());\n  const upb_oneofdef *oneof = upb_msgdef_ntooz(intern->desc->msgdef,\n                                              \"$name$\");\n  const upb_fielddef *field = upb_msg_whichoneof(intern->msg, oneof);\n  RETURN_STRING(field ? upb_fielddef_name(field) : \"\");\n}\n"
               ,(char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [5])0x77db8d,psVar5,(char (*) [11])"camel_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
    std::__cxx11::string::~string((string *)local_208);
  }
  WVar3 = Descriptor::well_known_type(message);
  if (WVar3 == WELLKNOWNTYPE_ANY) {
    io::Printer::Print<>
              ((Printer *)c_name.field_2._8_8_,
               "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n  ZEND_ARG_INFO(0, proto)\nZEND_END_ARG_INFO()\n\n"
              );
  }
  else if (WVar3 == WELLKNOWNTYPE_TIMESTAMP) {
    io::Printer::Print<>
              ((Printer *)c_name.field_2._8_8_,
               "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n  ZEND_ARG_INFO(0, datetime)\nZEND_END_ARG_INFO()\n\n"
              );
  }
  io::Printer::Print<char[7],std::__cxx11::string>
            ((Printer *)c_name.field_2._8_8_,
             "static zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n"
             ,(char (*) [7])0x77c27b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  for (field_1._4_4_ = 0; iVar4 = field_1._4_4_, iVar2 = Descriptor::field_count(message),
      iVar4 < iVar2; field_1._4_4_ = field_1._4_4_ + 1) {
    local_218 = Descriptor::field(message,field_1._4_4_);
    uVar1 = c_name.field_2._8_8_;
    psVar5 = FieldDescriptor::name_abi_cxx11_(local_218);
    UnderscoresToCamelCase((string *)local_238,psVar5,true);
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,
               "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n"
               ,(char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [11])"camel_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    std::__cxx11::string::~string((string *)local_238);
  }
  for (oneof_1._4_4_ = 0; iVar4 = oneof_1._4_4_, iVar2 = Descriptor::real_oneof_decl_count(message),
      iVar4 < iVar2; oneof_1._4_4_ = oneof_1._4_4_ + 1) {
    local_248 = Descriptor::oneof_decl(message,oneof_1._4_4_);
    uVar1 = c_name.field_2._8_8_;
    psVar5 = OneofDescriptor::name_abi_cxx11_(local_248);
    UnderscoresToCamelCase((string *)&i_5,psVar5,true);
    io::Printer::Print<char[7],std::__cxx11::string,char[11],std::__cxx11::string>
              ((Printer *)uVar1,
               "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
               (char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [11])"camel_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
    std::__cxx11::string::~string((string *)&i_5);
  }
  WVar3 = Descriptor::well_known_type(message);
  if (WVar3 == WELLKNOWNTYPE_ANY) {
    io::Printer::Print<char[7],std::__cxx11::string>
              ((Printer *)c_name.field_2._8_8_,
               "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n"
               ,(char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  else if (WVar3 == WELLKNOWNTYPE_TIMESTAMP) {
    io::Printer::Print<char[7],std::__cxx11::string>
              ((Printer *)c_name.field_2._8_8_,
               "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n"
               ,(char (*) [7])0x77c27b,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  io::Printer::Print<char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            ((Printer *)c_name.field_2._8_8_,
             "  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n  $c_name$_ce->create_object = Message_create;\n  zend_do_inheritance($c_name$_ce, message_ce);\n}\n\n"
             ,(char (*) [7])0x77c27b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [9])"php_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  for (local_26c = 0; iVar4 = Descriptor::nested_type_count(message), local_26c < iVar4;
      local_26c = local_26c + 1) {
    message_00 = Descriptor::nested_type(message,local_26c);
    GenerateCMessage(message_00,(Printer *)c_name.field_2._8_8_);
  }
  for (local_270 = 0; iVar4 = Descriptor::enum_type_count(message), local_270 < iVar4;
      local_270 = local_270 + 1) {
    desc = Descriptor::enum_type(message,local_270);
    GenerateCEnum(desc,(Printer *)c_name.field_2._8_8_);
  }
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenerateCMessage(const Descriptor* message, io::Printer* printer) {
  std::string c_name = message->full_name();
  c_name = StringReplace(c_name, ".", "_", true);
  std::string php_name = FullClassName(message, Options());
  php_name = StringReplace(php_name, "\\", "\\\\", true);
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "static PHP_METHOD($c_name$, __construct) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  zim_Message___construct(INTERNAL_FUNCTION_PARAM_PASSTHRU);\n"
      "}\n"
      "\n",
      "file_c_name", FilenameCName(message->file()),
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
      "static PHP_METHOD($c_name$, get$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n"
      "                                           \"$name$\");\n"
      "  zval ret;\n"
      "  Message_get(intern, f, &ret);\n"
      "  RETURN_COPY_VALUE(&ret);\n"
      "}\n"
      "\n"
      "static PHP_METHOD($c_name$, set$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_fielddef *f = upb_msgdef_ntofz(intern->desc->msgdef,\n"
      "                                           \"$name$\");\n"
      "  zval *val;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"z\", &val)\n"
      "      == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  Message_set(intern, f, val);\n"
      "  RETURN_COPY(getThis());\n"
      "}\n"
      "\n",
      "c_name", c_name,
      "name", field->name(),
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
      "static PHP_METHOD($c_name$, get$camel_name$) {\n"
      "  Message* intern = (Message*)Z_OBJ_P(getThis());\n"
      "  const upb_oneofdef *oneof = upb_msgdef_ntooz(intern->desc->msgdef,\n"
      "                                              \"$name$\");\n"
      "  const upb_fielddef *field = upb_msg_whichoneof(intern->msg, oneof);\n"
      "  RETURN_STRING(field ? upb_fielddef_name(field) : \"\");\n"
      "}\n",
      "c_name", c_name,
      "name", oneof->name(),
      "camel_name", UnderscoresToCamelCase(oneof->name(), true));
  }

  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_is, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, proto)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n"
      );
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
          "ZEND_BEGIN_ARG_INFO_EX(arginfo_timestamp_fromdatetime, 0, 0, 1)\n"
          "  ZEND_ARG_INFO(0, datetime)\n"
          "ZEND_END_ARG_INFO()\n"
          "\n"
      );
      break;
    default:
      break;
  }

  printer->Print(
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, __construct, arginfo_construct, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name);

  for (int i = 0; i < message->field_count(); i++) {
    auto field = message->field(i);
    printer->Print(
      "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n"
      "  PHP_ME($c_name$, set$camel_name$, arginfo_setter, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name,
      "camel_name", UnderscoresToCamelCase(field->name(), true));
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    auto oneof = message->oneof_decl(i);
    printer->Print(
      "  PHP_ME($c_name$, get$camel_name$, arginfo_void, ZEND_ACC_PUBLIC)\n",
      "c_name", c_name,
      "camel_name", UnderscoresToCamelCase(oneof->name(), true));
  }

  // Extra hand-written functions added to the well-known types.
  switch (message->well_known_type()) {
    case Descriptor::WELLKNOWNTYPE_ANY:
      printer->Print(
        "  PHP_ME($c_name$, is, arginfo_is, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, pack, arginfo_setter, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, unpack, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name);
      break;
    case Descriptor::WELLKNOWNTYPE_TIMESTAMP:
      printer->Print(
        "  PHP_ME($c_name$, fromDateTime, arginfo_timestamp_fromdatetime, ZEND_ACC_PUBLIC)\n"
        "  PHP_ME($c_name$, toDateTime, arginfo_void, ZEND_ACC_PUBLIC)\n",
        "c_name", c_name);
      break;
    default:
      break;
  } 

  printer->Print(
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
      "  $c_name$_ce->ce_flags |= ZEND_ACC_FINAL;\n"
      "  $c_name$_ce->create_object = Message_create;\n"
      "  zend_do_inheritance($c_name$_ce, message_ce);\n"
      "}\n"
      "\n",
      "c_name", c_name,
      "php_name", php_name);

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateCMessage(message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateCEnum(message->enum_type(i), printer);
  }
}